

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O3

int drive_compressor(archive_write_filter *f,private_data_conflict9 *data,int flush,void *src,
                    size_t length)

{
  ZSTD_outBuffer *pZVar1;
  anon_enum_32 aVar2;
  size_t sVar3;
  archive *a;
  int iVar4;
  long lVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  ZSTD_inBuffer in;
  void *local_48;
  size_t local_40;
  size_t local_38;
  
  local_38 = 0;
  pZVar1 = &data->out;
  sVar9 = (data->out).pos;
  local_48 = src;
  local_40 = length;
  do {
    sVar3 = local_38;
    aVar2 = data->state;
    if (aVar2 == resetting) {
      ZSTD_CCtx_reset(data->cstream,1);
      data->cur_frame = data->cur_frame + 1;
      data->state = running;
      data->cur_frame_in = 0;
      data->cur_frame_out = 0;
    }
    else if (aVar2 == finishing) {
      lVar5 = ZSTD_endStream(data->cstream,pZVar1);
      iVar4 = ZSTD_isError(lVar5);
      if (iVar4 != 0) {
LAB_00162674:
        a = f->archive;
        uVar6 = ZSTD_getErrorName(lVar5);
        archive_set_error(a,-1,"Zstd compression failed: %s",uVar6);
        return -0x1e;
      }
      if (lVar5 == 0) {
        data->state = resetting;
      }
    }
    else if (aVar2 == running) {
      if (local_38 == local_40) {
        return 0;
      }
      lVar5 = ZSTD_compressStream(data->cstream,pZVar1,&local_48);
      iVar4 = ZSTD_isError(lVar5);
      if (iVar4 != 0) goto LAB_00162674;
    }
    data->total_in = data->total_in + (local_38 - sVar3);
    uVar7 = (local_38 - sVar3) + data->cur_frame_in;
    data->cur_frame_in = uVar7;
    sVar3 = (data->out).pos;
    uVar8 = (sVar3 - sVar9) + data->cur_frame_out;
    data->cur_frame_out = uVar8;
    if ((data->state == running) &&
       ((data->max_frame_in <= uVar7 || (data->max_frame_out <= uVar8)))) {
      data->state = finishing;
    }
    if ((sVar3 == (data->out).size) || (sVar9 = sVar3, flush != 0 && sVar3 != 0)) {
      iVar4 = __archive_write_filter(f->next_filter,pZVar1->dst,sVar3);
      if (iVar4 != 0) {
        return -0x1e;
      }
      (data->out).pos = 0;
      sVar9 = 0;
    }
  } while( true );
}

Assistant:

static int
drive_compressor(struct archive_write_filter *f,
    struct private_data *data, int finishing)
{
	int ret;

	for (;;) {
		if (data->stream.avail_out == 0) {
			data->total_out += data->compressed_buffer_size;
			ret = __archive_write_filter(f->next_filter,
			    data->compressed,
			    data->compressed_buffer_size);
			if (ret != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			data->stream.next_out = data->compressed;
			data->stream.avail_out = data->compressed_buffer_size;
		}

		/* If there's nothing to do, we're done. */
		if (!finishing && data->stream.avail_in == 0)
			return (ARCHIVE_OK);

		ret = lzma_code(&(data->stream),
		    finishing ? LZMA_FINISH : LZMA_RUN );

		switch (ret) {
		case LZMA_OK:
			/* In non-finishing case, check if compressor
			 * consumed everything */
			if (!finishing && data->stream.avail_in == 0)
				return (ARCHIVE_OK);
			/* In finishing case, this return always means
			 * there's more work */
			break;
		case LZMA_STREAM_END:
			/* This return can only occur in finishing case. */
			if (finishing)
				return (ARCHIVE_OK);
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "lzma compression data error");
			return (ARCHIVE_FATAL);
		case LZMA_MEMLIMIT_ERROR:
			archive_set_error(f->archive, ENOMEM,
			    "lzma compression error: "
			    "%ju MiB would have been needed",
			    (uintmax_t)((lzma_memusage(&(data->stream))
				    + 1024 * 1024 -1)
				/ (1024 * 1024)));
			return (ARCHIVE_FATAL);
		default:
			/* Any other return value indicates an error. */
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "lzma compression failed:"
			    " lzma_code() call returned status %d",
			    ret);
			return (ARCHIVE_FATAL);
		}
	}
}